

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O1

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
erase_range(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
            *this,int start_key,int end_key,bool end_key_inclusive)

{
  int *piVar1;
  uint64_t *puVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  undefined7 in_register_00000009;
  ulong uVar9;
  int iVar10;
  int local_1c;
  
  local_1c = end_key;
  if ((int)CONCAT71(in_register_00000009,end_key_inclusive) == 0) {
    uVar5 = lower_bound<int>(this,&local_1c);
  }
  else {
    uVar5 = upper_bound<int>(this,&local_1c);
  }
  if (uVar5 == 0) {
    iVar10 = 0;
  }
  else {
    iVar6 = 0x7fffffff;
    if (uVar5 != this->data_capacity_) {
      iVar6 = this->key_slots_[(int)uVar5];
    }
    if ((int)uVar5 < 1) {
      iVar10 = 0;
    }
    else {
      piVar1 = this->key_slots_;
      puVar2 = this->bitmap_;
      iVar10 = 0;
      uVar7 = (ulong)uVar5;
      do {
        if (piVar1[uVar7 - 1] < start_key) break;
        piVar1[uVar7 - 1] = iVar6;
        if ((long)this->data_capacity_ < (long)uVar7) {
          __assert_fail("pos >= 0 && pos < data_capacity_",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex_nodes.h"
                        ,0x1dc,
                        "bool alex::AlexDataNode<int, int>::check_exists(int) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                       );
        }
        uVar8 = uVar7 - 1;
        uVar9 = uVar8 >> 6 & 0x3ffffff;
        uVar3 = puVar2[uVar9];
        iVar10 = iVar10 + (uint)((uVar3 >> (uVar8 & 0x3f) & 1) != 0);
        puVar2[uVar9] = uVar3 & ~(1L << (uVar8 & 0x3f));
        bVar4 = 1 < (long)uVar7;
        uVar7 = uVar8;
      } while (bVar4);
    }
    iVar6 = this->num_keys_ - iVar10;
    this->num_keys_ = iVar6;
    if ((double)iVar6 < this->contraction_threshold_) {
      resize(this,0.8,false,false,false);
      this->num_resizes_ = this->num_resizes_ + 1;
    }
  }
  return iVar10;
}

Assistant:

int erase_range(T start_key, T end_key, bool end_key_inclusive = false) {
    int pos;
    if (end_key_inclusive) {
      pos = upper_bound(end_key);
    } else {
      pos = lower_bound(end_key);
    }

    if (pos == 0) return 0;

    // Erase preceding positions until key value is below the start key
    int num_erased = 0;
    T next_key;
    if (pos == data_capacity_) {
      next_key = kEndSentinel_;
    } else {
      next_key = ALEX_DATA_NODE_KEY_AT(pos);
    }
    pos--;
    while (pos >= 0 &&
           key_greaterequal(ALEX_DATA_NODE_KEY_AT(pos), start_key)) {
      ALEX_DATA_NODE_KEY_AT(pos) = next_key;
      num_erased += check_exists(pos);
      unset_bit(pos);
      pos--;
    }

    num_keys_ -= num_erased;

    if (num_keys_ < contraction_threshold_) {
      resize(kMaxDensity_);  // contract
      num_resizes_++;
    }
    return num_erased;
  }